

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_open_dir(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_fs_t req;
  uv_fs_t uStack_1c8;
  
  loop = uv_default_loop();
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_1c8,".",0,0,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    pcVar4 = "r >= 0";
    uVar3 = 0xaa1;
  }
  else if (uStack_1c8.result < 0) {
    pcVar4 = "req.result >= 0";
    uVar3 = 0xaa2;
  }
  else if (uStack_1c8.ptr == (void *)0x0) {
    uv_fs_req_cleanup(&uStack_1c8);
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&uStack_1c8,iVar1,(uv_fs_cb)0x0);
    if (iVar1 == 0) {
      iVar1 = uv_fs_open(loop,&uStack_1c8,".",0,0,open_cb_simple);
      if (iVar1 == 0) {
        if (open_cb_count == 0) {
          uv_run(loop,UV_RUN_DEFAULT);
          if (open_cb_count == 1) {
            puVar2 = uv_default_loop();
            close_loop(puVar2);
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
            uVar3 = 0xab1;
          }
          else {
            pcVar4 = "open_cb_count == 1";
            uVar3 = 0xaaf;
          }
        }
        else {
          pcVar4 = "open_cb_count == 0";
          uVar3 = 0xaad;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0xaab;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0xaa8;
    }
  }
  else {
    pcVar4 = "req.ptr == NULL";
    uVar3 = 0xaa3;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_open_dir) {
  const char* path;
  uv_fs_t req;
  int r, file;

  path = ".";
  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, path, O_RDONLY, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(req.ptr == NULL);
  file = r;
  uv_fs_req_cleanup(&req);

  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);

  r = uv_fs_open(loop, &req, path, O_RDONLY, 0, open_cb_simple);
  ASSERT(r == 0);

  ASSERT(open_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}